

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_innerproduct_dropout(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  reference ppLVar9;
  reference pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float *pfVar13;
  reference pvVar14;
  int iVar15;
  long in_RDI;
  int top_blob_index_final;
  int i_2;
  float *bias;
  int j_1;
  float *conv_weight_outch;
  int i_1;
  float *weight;
  int weight_per_outch;
  int num_output;
  float scale;
  Dropout *dropout;
  InnerProduct *innerproduct;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  FILE *in_stack_ffffffffffffff80;
  int local_64;
  int local_54;
  int local_44;
  int local_18;
  int local_10;
  
  sVar8 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28));
  iVar6 = (int)sVar8;
  local_10 = 0;
  do {
    if (iVar6 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
               (long)local_10);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar5) {
      ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                           (long)local_10);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->tops,0);
      iVar2 = *pvVar10;
      local_18 = local_10;
      do {
        do {
          do {
            local_18 = local_18 + 1;
            if (iVar6 <= local_18) goto LAB_00117346;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x28),
                       (long)local_18);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff80,
                                    (char *)CONCAT44(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78));
          } while (bVar5);
          ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x28),(long)local_18);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar9)->bottoms);
        } while (sVar8 != 1);
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar9)->bottoms,0);
      } while (*pvVar10 != iVar2);
LAB_00117346:
      if (local_18 != iVar6) {
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_10);
        pLVar3 = *ppLVar9;
        ppLVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x28),(long)local_18);
        pLVar4 = *ppLVar9;
        in_stack_ffffffffffffff80 = _stderr;
        uVar11 = std::__cxx11::string::c_str();
        uVar12 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffff80,"fuse_innerproduct_dropout %s %s\n",uVar11,uVar12);
        fVar1 = *(float *)&pLVar4[1]._vptr_Layer;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          iVar2 = *(int *)&pLVar3[1]._vptr_Layer;
          iVar7 = *(int *)&pLVar3[1].one_blob_only / iVar2;
          pfVar13 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)&pLVar3[1].bottoms.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish);
          for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
            iVar15 = iVar7 * local_44;
            for (local_54 = 0; local_54 < iVar7; local_54 = local_54 + 1) {
              pfVar13[(long)iVar15 + (long)local_54] =
                   fVar1 * pfVar13[(long)iVar15 + (long)local_54];
            }
          }
          if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) != 0) {
            pfVar13 = ncnn::Mat::operator_cast_to_float_((Mat *)&pLVar3[2].type._M_string_length);
            for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
              pfVar13[local_64] = fVar1 * pfVar13[local_64];
            }
          }
        }
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
        iVar2 = *pvVar10;
        in_stack_ffffffffffffff78 = iVar2;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        *pvVar10 = in_stack_ffffffffffffff78;
        in_stack_ffffffffffffff7c = local_10;
        pvVar14 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),
                             (long)iVar2);
        pvVar14->producer = in_stack_ffffffffffffff7c;
        std::__cxx11::string::operator=((string *)&pLVar4->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_dropout()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Dropout
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Dropout")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Dropout to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[j];

        fprintf(stderr, "fuse_innerproduct_dropout %s %s\n", innerproduct->name.c_str(), dropout->name.c_str());

        float scale = dropout->scale;
        if (scale != 1.f)
        {
            const int num_output = innerproduct->num_output;
            const int weight_per_outch = innerproduct->weight_data_size / num_output;

            float* weight = innerproduct->weight_data;
            for (int i=0; i<num_output; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= scale;
                }
            }

            if (innerproduct->bias_term)
            {
                float* bias = innerproduct->bias_data;
                for (int i=0; i<num_output; i++)
                {
                    bias[i] *= scale;
                }
            }
        }

        int top_blob_index_final = dropout->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        dropout->type = "ncnnfused";
    }

    return 0;
}